

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * ensureFilesExist(char *aDestination,char *aSourcePathsAndNames)

{
  int iVar1;
  char *aFilePathAndName;
  char *pcVar2;
  size_t __n;
  char *in_RSI;
  char *in_RDI;
  size_t lLen;
  char *p2;
  char *p;
  char *lDestination;
  char *local_28;
  char *local_20;
  char *local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    aFilePathAndName = (char *)strlen(in_RSI);
    local_28 = in_RSI;
    local_20 = in_RDI;
    if (aFilePathAndName == (char *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      while (pcVar2 = strchr(local_28,0x7c), pcVar2 != (char *)0x0) {
        aFilePathAndName = pcVar2 + -(long)local_28;
        memmove(local_20,local_28,(size_t)aFilePathAndName);
        local_20[(long)aFilePathAndName] = '\0';
        iVar1 = fileExists(aFilePathAndName);
        if (iVar1 != 0) {
          aFilePathAndName[(long)local_20] = '|';
          local_20 = aFilePathAndName + (long)local_20 + 1;
        }
        local_28 = pcVar2 + 1;
      }
      iVar1 = fileExists(aFilePathAndName);
      local_8 = in_RDI;
      if (iVar1 == 0) {
        local_20[-1] = '\0';
      }
      else {
        __n = strlen(local_28);
        memmove(local_20,local_28,__n);
        local_20[__n] = '\0';
      }
    }
  }
  return local_8;
}

Assistant:

static char * ensureFilesExist(char * aDestination,
        char const * aSourcePathsAndNames)
{
        char * lDestination = aDestination;
        char const * p;
        char const * p2;
        size_t lLen;

        if (!aSourcePathsAndNames)
        {
                return NULL;
        }
        lLen = strlen(aSourcePathsAndNames);
        if (!lLen)
        {
                return NULL;
        }

        p = aSourcePathsAndNames;
        while ((p2 = strchr(p, '|')) != NULL)
        {
                lLen = p2 - p;
                memmove(lDestination, p, lLen);
                lDestination[lLen] = '\0';
                if (fileExists(lDestination))
                {
                        lDestination += lLen;
                        *lDestination = '|';
                        lDestination++;
                }
                p = p2 + 1;
        }
        if (fileExists(p))
        {
                lLen = strlen(p);
                memmove(lDestination, p, lLen);
                lDestination[lLen] = '\0';
        }
        else
        {
                *(lDestination - 1) = '\0';
        }
        return aDestination;
}